

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall value_string::test_method(value_string *this)

{
  undefined1 uVar1;
  size_t sVar2;
  char *local_3e8;
  char *local_3e0;
  shared_count local_3d8;
  Value value;
  Value value1;
  undefined **local_3b0;
  char *local_3a8;
  shared_count local_3a0;
  char **local_398;
  Value value2;
  string str2;
  char *local_360;
  char *local_358;
  Value local_350 [16];
  string str1;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  output_test_stream output;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str1,"value #1",(allocator<char> *)&output);
  dynamicgraph::command::Value::Value(&value1,(string *)&str1);
  dynamicgraph::command::Value::Value(&value,&value1);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x12a);
  uVar1 = dynamicgraph::command::Value::operator==(&value1,&value);
  str2._M_dataplus._M_p._0_1_ = uVar1;
  str2._M_string_length = 0;
  str2.field_2._M_allocated_capacity = 0;
  local_3b0 = (undefined **)0x10e107;
  local_3a8 = "";
  _output = &PTR__lazy_ostream_00112c30;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1d8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&str2.field_2._M_allocated_capacity);
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_1f0,1);
  dynamicgraph::command::operator<<((ostream *)&output,&value1);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x12f);
  local_220 = "Type=string, value=value #1";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("Type=string, value=value #1");
  local_218 = "Type=string, value=value #1" + sVar2;
  boost::test_tools::output_test_stream::is_equal(&local_3b0,&output,&local_220,1);
  local_3e8 = "output.is_equal(\"Type=string, value=value #1\")";
  local_3e0 = "";
  str2._M_string_length = str2._M_string_length & 0xffffffffffffff00;
  str2._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00112c30;
  str2.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_228 = "";
  str2.field_2._8_8_ = &local_3e8;
  boost::test_tools::tt_detail::report_assertion(&local_3b0,&str2,&local_230,0x12f,1,0,0);
  boost::detail::shared_count::~shared_count(&local_3a0);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_240,1);
  dynamicgraph::command::operator<<((ostream *)&output,&value);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x135);
  local_270 = "Type=string, value=value #1";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("Type=string, value=value #1");
  local_268 = "Type=string, value=value #1" + sVar2;
  boost::test_tools::output_test_stream::is_equal(&local_3b0,&output,&local_270,1);
  local_3e8 = "output.is_equal(\"Type=string, value=value #1\")";
  local_3e0 = "";
  str2._M_string_length = str2._M_string_length & 0xffffffffffffff00;
  str2._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00112c30;
  str2.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_278 = "";
  str2.field_2._8_8_ = &local_3e8;
  boost::test_tools::tt_detail::report_assertion(&local_3b0,&str2,&local_280,0x135,1,0,0);
  boost::detail::shared_count::~shared_count(&local_3a0);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str2,"value #2",(allocator<char> *)&output);
  dynamicgraph::command::Value::Value(&value2,(string *)&str2);
  dynamicgraph::command::Value::operator=(local_350,&value);
  dynamicgraph::command::Value::~Value(local_350);
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_290,1);
  dynamicgraph::command::operator<<((ostream *)&output,&value2);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x13f);
  local_2c0 = "Type=string, value=value #2";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("Type=string, value=value #2");
  local_2b8 = "Type=string, value=value #2" + sVar2;
  boost::test_tools::output_test_stream::is_equal(&local_3e8,&output,&local_2c0,1);
  local_360 = "output.is_equal(\"Type=string, value=value #2\")";
  local_358 = "";
  local_3a8 = (char *)((ulong)local_3a8 & 0xffffffffffffff00);
  local_3b0 = &PTR__lazy_ostream_00112c30;
  local_3a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_2c8 = "";
  local_398 = &local_360;
  boost::test_tools::tt_detail::report_assertion(&local_3e8,&local_3b0,&local_2d0,0x13f,1,0,0);
  boost::detail::shared_count::~shared_count(&local_3d8);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_2e0,1);
  dynamicgraph::command::operator<<((ostream *)&output,&value);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x145);
  local_310 = "Type=string, value=value #2";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("Type=string, value=value #2");
  local_308 = "Type=string, value=value #2" + sVar2;
  boost::test_tools::output_test_stream::is_equal(&local_3e8,&output,&local_310,1);
  local_360 = "output.is_equal(\"Type=string, value=value #2\")";
  local_358 = "";
  local_3a8 = (char *)((ulong)local_3a8 & 0xffffffffffffff00);
  local_3b0 = &PTR__lazy_ostream_00112c30;
  local_3a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_318 = "";
  local_398 = &local_360;
  boost::test_tools::tt_detail::report_assertion(&local_3e8,&local_3b0,&local_320,0x145,1,0,0);
  boost::detail::shared_count::~shared_count(&local_3d8);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  dynamicgraph::command::Value::~Value(&value2);
  std::__cxx11::string::~string((string *)&str2);
  dynamicgraph::command::Value::~Value(&value);
  dynamicgraph::command::Value::~Value(&value1);
  std::__cxx11::string::~string((string *)&str1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_string) {
  using dg::command::Value;

  std::string str1("value #1");
  Value value1(str1);
  Value value = value1;

  BOOST_CHECK(value1 == value);

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(output.is_equal("Type=string, value=value #1"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(output.is_equal("Type=string, value=value #1"));
  }

  std::string str2("value #2");
  Value value2(str2);
  value = value2;

  {
    output_test_stream output;
    output << value2;
    BOOST_CHECK(output.is_equal("Type=string, value=value #2"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(output.is_equal("Type=string, value=value #2"));
  }
}